

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::EntityType::CreateTokenisedString
          (KString *__return_storage_ptr__,EntityType *this,KString *Seperator)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(Seperator->_M_dataplus)._M_p,Seperator->_M_string_length);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(Seperator->_M_dataplus)._M_p,Seperator->_M_string_length);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(Seperator->_M_dataplus)._M_p,Seperator->_M_string_length);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(Seperator->_M_dataplus)._M_p,Seperator->_M_string_length);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(Seperator->_M_dataplus)._M_p,Seperator->_M_string_length);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(Seperator->_M_dataplus)._M_p,Seperator->_M_string_length);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString EntityType::CreateTokenisedString( const KString & Seperator /*= ","*/ ) const
{
    KStringStream ss;

    ss << ( KUINT16 )m_ui8EntityKind  << Seperator
       << ( KUINT16 )m_ui8Domain      << Seperator
       << m_ui16Country               << Seperator
       << ( KUINT16 )m_ui8Category    << Seperator
       << ( KUINT16 )m_ui8SubCategory << Seperator
       << ( KUINT16 )m_ui8Specific    << Seperator
       << ( KUINT16 )m_ui8Extra;

    return ss.str();
}